

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkCreateNodeOr(Abc_Ntk_t *pNtk,Vec_Ptr_t *vFanins)

{
  Mem_Flex_t *pMan;
  DdManager *dd;
  Hop_Man_t *p;
  int iVar1;
  Abc_Obj_t *pObj;
  char *pcVar2;
  DdNode *pDVar3;
  Hop_Obj_t *pHVar4;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vFanins_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if ((iVar1 == 0) && (iVar1 = Abc_NtkIsNetlist(pNtk), iVar1 == 0)) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x305,"Abc_Obj_t *Abc_NtkCreateNodeOr(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  pObj = Abc_NtkCreateNode(pNtk);
  for (local_24 = 0; local_24 < vFanins->nSize; local_24 = local_24 + 1) {
    Abc_ObjAddFanin(pObj,(Abc_Obj_t *)vFanins->pArray[local_24]);
  }
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    iVar1 = Abc_NtkHasBdd(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkHasAig(pNtk);
      if (iVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                      ,0x312,"Abc_Obj_t *Abc_NtkCreateNodeOr(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      p = (Hop_Man_t *)pNtk->pManFunc;
      iVar1 = Vec_PtrSize(vFanins);
      pHVar4 = Hop_CreateOr(p,iVar1);
      (pObj->field_5).pData = pHVar4;
    }
    else {
      dd = (DdManager *)pNtk->pManFunc;
      iVar1 = Vec_PtrSize(vFanins);
      pDVar3 = Extra_bddCreateOr(dd,iVar1);
      (pObj->field_5).pData = pDVar3;
      Cudd_Ref((DdNode *)(pObj->field_5).pData);
    }
  }
  else {
    pMan = (Mem_Flex_t *)pNtk->pManFunc;
    iVar1 = Vec_PtrSize(vFanins);
    pcVar2 = Abc_SopCreateOr(pMan,iVar1,(int *)0x0);
    (pObj->field_5).pData = pcVar2;
  }
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeOr( Abc_Ntk_t * pNtk, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk );   
    for ( i = 0; i < vFanins->nSize; i++ )
        Abc_ObjAddFanin( pNode, (Abc_Obj_t *)vFanins->pArray[i] );
    if ( Abc_NtkHasSop(pNtk) )
        pNode->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNtk->pManFunc, Vec_PtrSize(vFanins), NULL );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Extra_bddCreateOr( (DdManager *)pNtk->pManFunc, Vec_PtrSize(vFanins) ), Cudd_Ref((DdNode *)pNode->pData); 
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_CreateOr( (Hop_Man_t *)pNtk->pManFunc, Vec_PtrSize(vFanins) ); 
    else
        assert( 0 );
    return pNode;
}